

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
          (cmTargetCollectLinkLanguages *this,cmTarget *target,string *config,
          hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          *languages,cmTarget *head)

{
  cmMakefile *pcVar1;
  cmTarget *head_local;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *languages_local;
  string *config_local;
  cmTarget *target_local;
  cmTargetCollectLinkLanguages *this_local;
  
  config_local = (string *)target;
  target_local = (cmTarget *)this;
  std::__cxx11::string::string((string *)this,(string *)config);
  this->Languages = languages;
  this->HeadTarget = head;
  pcVar1 = cmTarget::GetMakefile((cmTarget *)config_local);
  this->Makefile = pcVar1;
  this->Target = (cmTarget *)config_local;
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::set
            (&this->Visited);
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::insert
            (&this->Visited,(value_type *)&config_local);
  return;
}

Assistant:

cmTargetCollectLinkLanguages(cmTarget const* target,
                               const std::string& config,
                               UNORDERED_SET<std::string>& languages,
                               cmTarget const* head):
    Config(config), Languages(languages), HeadTarget(head),
    Makefile(target->GetMakefile()), Target(target)
  { this->Visited.insert(target); }